

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringCache.h
# Opt level: O2

void __thiscall
Js::StringCache::Initialize(StringCache *this,ScriptContext *scriptContext,StaticType *staticString)

{
  Memory::WriteBarrierPtr<Js::ScriptContext>::WriteBarrierSet(&this->scriptContext,scriptContext);
  Memory::WriteBarrierPtr<Js::StaticType>::WriteBarrierSet(&this->stringTypeStatic,staticString);
  return;
}

Assistant:

void Initialize(ScriptContext* scriptContext, StaticType* staticString)
    {
        this->scriptContext = scriptContext;
        this->stringTypeStatic = staticString;
    }